

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O2

void __thiscall
google::protobuf::internal::InternalMetadataWithArena::DoSwap
          (InternalMetadataWithArena *this,UnknownFieldSet *other)

{
  void *pvVar1;
  _Vector_impl_data *this_00;
  
  pvVar1 = (this->
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           ).ptr_;
  if (((ulong)pvVar1 & 1) == 0) {
    this_00 = (_Vector_impl_data *)
              InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              ::mutable_unknown_fields_slow
                        (&this->
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        );
  }
  else {
    this_00 = (_Vector_impl_data *)((ulong)pvVar1 & 0xfffffffffffffffe);
  }
  std::_Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ::_Vector_impl_data::_M_swap_data(this_00,(_Vector_impl_data *)other);
  return;
}

Assistant:

void DoSwap(UnknownFieldSet* other) { mutable_unknown_fields()->Swap(other); }